

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  char cVar1;
  DeathTestOutcome DVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  ostream *poVar7;
  ostream *poVar8;
  long lVar9;
  size_t sVar10;
  Message MVar11;
  char *pcVar12;
  bool bVar13;
  Message buffer;
  regmatch_t match;
  String error_message;
  Message local_60;
  Message local_58;
  String local_50;
  char *local_40;
  long local_38;
  
  if (this->spawned_ != true) {
    return false;
  }
  GetCapturedStream((internal *)&local_40,(CapturedStream **)&g_captured_stderr);
  Message::Message(&local_60);
  poVar7 = (ostream *)(local_60.ss_ + 0x10);
  if (local_60.ss_ == (StrStream *)0x0) {
    poVar7 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Death test: ",0xc);
  pcVar12 = this->statement_;
  if (pcVar12 == (char *)0x0) {
    MVar11.ss_ = local_60.ss_ + 0x10;
    sVar5 = 6;
    pcVar12 = "(null)";
  }
  else {
    MVar11.ss_ = local_60.ss_;
    if (local_60.ss_ != (StrStream *)0x0) {
      MVar11.ss_ = (StrStream *)(local_60.ss_ + 0x10);
    }
    sVar5 = strlen(pcVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar11.ss_,pcVar12,sVar5);
  poVar7 = (ostream *)(local_60.ss_ + 0x10);
  if (local_60.ss_ == (StrStream *)0x0) {
    poVar7 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  DVar2 = this->outcome_;
  if (DVar2 == DIED) {
    if (status_ok) {
      if (this->regex_[8] == (RE)0x1) {
        iVar4 = regexec((regex_t *)(this->regex_ + 0x50),local_40,1,(regmatch_t *)&local_50,0);
        bVar13 = iVar4 == 0;
      }
      else {
        bVar13 = false;
      }
      if (bVar13 == false) {
        poVar7 = (ostream *)(local_60.ss_ + 0x10);
        if (local_60.ss_ == (StrStream *)0x0) {
          poVar7 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    Result: died but not with expected error.\n",0x2e);
        poVar7 = (ostream *)(local_60.ss_ + 0x10);
        if (local_60.ss_ == (StrStream *)0x0) {
          poVar7 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Expected: ",0xc);
        pcVar12 = *(char **)this->regex_;
        if (pcVar12 == (char *)0x0) {
          MVar11.ss_ = local_60.ss_ + 0x10;
          sVar5 = 6;
          pcVar12 = "(null)";
        }
        else {
          MVar11.ss_ = local_60.ss_;
          if (local_60.ss_ != (StrStream *)0x0) {
            MVar11.ss_ = (StrStream *)(local_60.ss_ + 0x10);
          }
          sVar5 = strlen(pcVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar11.ss_,pcVar12,sVar5);
        poVar7 = (ostream *)(local_60.ss_ + 0x10);
        if (local_60.ss_ == (StrStream *)0x0) {
          poVar7 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = (ostream *)(local_60.ss_ + 0x10);
        if (local_60.ss_ == (StrStream *)0x0) {
          poVar7 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Actual msg: ",0xc);
        pcVar12 = local_40;
        poVar7 = (ostream *)(local_60.ss_ + 0x10);
        if (local_60.ss_ == (StrStream *)0x0) {
          poVar7 = (ostream *)0x0;
        }
        if (local_40 == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(null)",6);
        }
        else if (local_38 != 0) {
          lVar9 = 0;
          do {
            if (pcVar12[lVar9] == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
            }
            else {
              local_50.c_str_._0_1_ = pcVar12[lVar9];
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_50,1);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != local_38);
        }
      }
      goto LAB_00151393;
    }
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    Result: died but not with expected exit code:\n",0x32);
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"            ",0xc);
    uVar3 = this->status_;
    Message::Message(&local_58);
    uVar6 = uVar3 & 0x7f;
    if (uVar6 == 0) {
      poVar7 = (ostream *)(CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 0x10);
      if (CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Exited with exit status ",0x18);
      poVar8 = (ostream *)(CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 0x10);
      if (CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) == 0) {
        poVar8 = (ostream *)0x0;
      }
      std::ostream::operator<<(poVar8,uVar3 >> 8 & 0xff);
    }
    else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
      poVar7 = (ostream *)(CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 0x10);
      if (CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Terminated by signal ",0x15);
      poVar8 = (ostream *)(CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 0x10);
      if (CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) == 0) {
        poVar8 = (ostream *)0x0;
      }
      std::ostream::operator<<(poVar8,uVar6);
    }
    if ((char)uVar3 < '\0') {
      poVar7 = (ostream *)(CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 0x10);
      if (CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) == 0) {
        poVar7 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (core dumped)",0xe);
    }
    StrStreamToString((internal *)&local_50,
                      (StrStream *)CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_));
    if ((long *)CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_58.ss_._1_7_,(char)local_58.ss_) + 8))();
    }
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    lVar9 = CONCAT71(local_50.c_str_._1_7_,(char)local_50.c_str_);
    if (lVar9 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(null)",6);
    }
    else if (local_50.length_ != 0) {
      sVar10 = 0;
      do {
        cVar1 = *(char *)(lVar9 + sVar10);
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
        }
        else {
          local_58.ss_._0_1_ = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != local_50.length_);
    }
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((void *)CONCAT71(local_50.c_str_._1_7_,(char)local_50.c_str_) != (void *)0x0) {
      operator_delete__((void *)CONCAT71(local_50.c_str_._1_7_,(char)local_50.c_str_));
    }
  }
  else if (DVar2 == LIVED) {
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    Result: failed to die.\n",0x1b);
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Error msg: ",0xc);
    pcVar12 = local_40;
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    if (local_40 == (char *)0x0) {
LAB_00151120:
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(null)",6);
    }
    else if (local_38 != 0) {
      lVar9 = 0;
      do {
        if (pcVar12[lVar9] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
        }
        else {
          local_50.c_str_._0_1_ = pcVar12[lVar9];
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_50,1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_38);
    }
  }
  else if (DVar2 == RETURNED) {
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    Result: illegal return in test statement.\n",0x2e);
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Error msg: ",0xc);
    pcVar12 = local_40;
    poVar7 = (ostream *)(local_60.ss_ + 0x10);
    if (local_60.ss_ == (StrStream *)0x0) {
      poVar7 = (ostream *)0x0;
    }
    if (local_40 == (char *)0x0) goto LAB_00151120;
    if (local_38 != 0) {
      lVar9 = 0;
      do {
        if (pcVar12[lVar9] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\0",2);
        }
        else {
          local_50.c_str_._0_1_ = pcVar12[lVar9];
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_50,1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != local_38);
    }
  }
  else {
    GTestLog::GTestLog((GTestLog *)&local_50,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,0x197a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)&local_50);
  }
  bVar13 = false;
LAB_00151393:
  StrStreamToString((internal *)&local_50,local_60.ss_);
  String::operator=((String *)&DeathTest::last_death_test_message_,&local_50);
  if ((void *)CONCAT71(local_50.c_str_._1_7_,(char)local_50.c_str_) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_50.c_str_._1_7_,(char)local_50.c_str_));
  }
  if (local_60.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_60.ss_ + 8))();
  }
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  return bVar13;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const String error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg: " << error_message;
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg: " << error_message;
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg: " << error_message;
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n";
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}